

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndFrame(void)

{
  bool bVar1;
  ImGuiWindow *window_00;
  bool bVar2;
  ImGuiWindow **ppIVar3;
  float fVar4;
  byte local_2f;
  byte local_2e;
  ImGuiWindow *window;
  int i;
  bool is_elapsed;
  bool is_delivered;
  ImGuiContext *local_10;
  ImGuiContext *g;
  
  local_10 = GImGui;
  if ((GImGui->Initialized & 1U) == 0) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                  ,0xf82,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    if ((GImGui->FrameScopeActive & 1U) == 0) {
      __assert_fail("g.FrameScopeActive && \"Forgot to call ImGui::NewFrame()?\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                    ,0xf85,"void ImGui::EndFrame()");
    }
    bVar1 = false;
    if ((GImGui->IO).ImeSetInputScreenPosFn != (_func_void_int_int *)0x0) {
      fVar4 = (GImGui->PlatformImeLastPos).x;
      bVar1 = true;
      if ((fVar4 != 3.4028235e+38) || (NAN(fVar4))) {
        _i = operator-(&GImGui->PlatformImeLastPos,&GImGui->PlatformImePos);
        fVar4 = ImLengthSqr((ImVec2 *)&i);
        bVar1 = 0.0001 < fVar4;
      }
    }
    if (bVar1) {
      (*(local_10->IO).ImeSetInputScreenPosFn)
                ((int)(local_10->PlatformImePos).x,(int)(local_10->PlatformImePos).y);
      local_10->PlatformImeLastPos = local_10->PlatformImePos;
    }
    if ((local_10->CurrentWindowStack).Size != 1) {
      if ((local_10->CurrentWindowStack).Size < 2) {
        if ((local_10->CurrentWindowStack).Size != 1) {
          __assert_fail("g.CurrentWindowStack.Size == 1 && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                        ,0xf9a,"void ImGui::EndFrame()");
        }
      }
      else {
        if ((local_10->CurrentWindowStack).Size != 1) {
          __assert_fail("g.CurrentWindowStack.Size == 1 && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                        ,0xf94,"void ImGui::EndFrame()");
        }
        while (1 < (local_10->CurrentWindowStack).Size) {
          End();
        }
      }
    }
    local_10->FrameScopePushedImplicitWindow = false;
    if ((local_10->CurrentWindow != (ImGuiWindow *)0x0) &&
       ((local_10->CurrentWindow->WriteAccessed & 1U) == 0)) {
      local_10->CurrentWindow->Active = false;
    }
    End();
    if (local_10->NavWindowingTarget != (ImGuiWindow *)0x0) {
      NavUpdateWindowingOverlay();
    }
    if ((local_10->DragDropActive & 1U) != 0) {
      bVar1 = (local_10->DragDropPayload).Delivery;
      local_2e = 0;
      if ((local_10->DragDropPayload).DataFrameCount + 1 < local_10->FrameCount) {
        local_2f = 1;
        if ((local_10->DragDropSourceFlags & 0x20U) == 0) {
          bVar2 = IsMouseDown(local_10->DragDropMouseButton);
          local_2f = bVar2 ^ 0xff;
        }
        local_2e = local_2f;
      }
      if (((bVar1 & 1U) != 0) || ((local_2e & 1) != 0)) {
        ClearDragDrop();
      }
    }
    if (((local_10->DragDropActive & 1U) != 0) &&
       (local_10->DragDropSourceFrameCount < local_10->FrameCount)) {
      local_10->DragDropWithinSourceOrTarget = true;
      SetTooltip("...");
      local_10->DragDropWithinSourceOrTarget = false;
    }
    local_10->FrameScopeActive = false;
    local_10->FrameCountEnded = local_10->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    ImVector<ImGuiWindow_*>::resize(&local_10->WindowsSortBuffer,0);
    ImVector<ImGuiWindow_*>::reserve(&local_10->WindowsSortBuffer,(local_10->Windows).Size);
    for (window._0_4_ = 0; (int)window != (local_10->Windows).Size; window._0_4_ = (int)window + 1)
    {
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&local_10->Windows,(int)window);
      window_00 = *ppIVar3;
      if (((window_00->Active & 1U) == 0) || ((window_00->Flags & 0x1000000U) == 0)) {
        AddWindowToSortBuffer(&local_10->WindowsSortBuffer,window_00);
      }
    }
    if ((local_10->Windows).Size != (local_10->WindowsSortBuffer).Size) {
      __assert_fail("g.Windows.Size == g.WindowsSortBuffer.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                    ,0xfcd,"void ImGui::EndFrame()");
    }
    ImVector<ImGuiWindow_*>::swap(&local_10->Windows,&local_10->WindowsSortBuffer);
    (local_10->IO).MetricsActiveWindows = local_10->WindowsActiveCount;
    ((local_10->IO).Fonts)->Locked = false;
    (local_10->IO).MouseWheelH = 0.0;
    (local_10->IO).MouseWheel = 0.0;
    ImVector<unsigned_short>::resize(&(local_10->IO).InputQueueCharacters,0);
    memset((local_10->IO).NavInputs,0,0x54);
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;
    IM_ASSERT(g.FrameScopeActive && "Forgot to call ImGui::NewFrame()?");

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Report when there is a mismatch of Begin/BeginChild vs End/EndChild calls. Important: Remember that the Begin/BeginChild API requires you
    // to always call End/EndChild even if Begin/BeginChild returns false! (this is unfortunately inconsistent with most other Begin* API).
    if (g.CurrentWindowStack.Size != 1)
    {
        if (g.CurrentWindowStack.Size > 1)
        {
            IM_ASSERT(g.CurrentWindowStack.Size == 1 && "Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?");
            while (g.CurrentWindowStack.Size > 1) // FIXME-ERRORHANDLING
                End();
        }
        else
        {
            IM_ASSERT(g.CurrentWindowStack.Size == 1 && "Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?");
        }
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.FrameScopePushedImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Show CTRL+TAB list window
    if (g.NavWindowingTarget != NULL)
        NavUpdateWindowingOverlay();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount)
    {
        g.DragDropWithinSourceOrTarget = true;
        SetTooltip("...");
        g.DragDropWithinSourceOrTarget = false;
    }

    // End frame
    g.FrameScopeActive = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);
    g.Windows.swap(g.WindowsSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}